

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

type_caster<bool,_void> *
pybind11::detail::load_type<bool,void>(type_caster<bool,_void> *conv,handle *handle)

{
  PyObject *pPVar1;
  bool bVar2;
  runtime_error *this;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pPVar1 = handle->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    if (pPVar1 == (PyObject *)&_Py_TrueStruct) {
      bVar2 = true;
    }
    else {
      if (pPVar1 != (PyObject *)&_Py_FalseStruct) goto LAB_003daf61;
      bVar2 = false;
    }
    conv->value = bVar2;
    return conv;
  }
LAB_003daf61:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(handle->m_ptr->ob_type);
  pybind11::str::operator_cast_to_string(&local_88,(str *)&local_f0);
  std::operator+(&local_68,"Unable to cast Python instance of type ",&local_88);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar4) {
    local_e8.field_2._M_allocated_capacity = *psVar4;
    local_e8.field_2._8_8_ = plVar3[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar4;
  }
  local_e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  type_id<bool>();
  std::operator+(&local_48,&local_e8,&local_a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_c8 == plVar5) {
    local_b8 = *plVar5;
    lStack_b0 = plVar3[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar5;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  *(undefined ***)this = &PTR__runtime_error_0071c038;
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(handle.get_type()) + " to C++ type '" + type_id<T>() + "''");
#endif
    }
    return conv;
}